

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.hpp
# Opt level: O2

extent<pstore::repo::fragment>
pstore::repo::fragment::
alloc<pstore::transaction_base,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
          (transaction_base *transaction,
          pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
          first,pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                last)

{
  size_t size;
  extent<pstore::repo::fragment> eVar1;
  pair<std::shared_ptr<void>,_pstore::address> storage;
  
  check_range_is_sorted<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
            (first,last);
  size = size_bytes<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                   (first,last);
  transaction_base::alloc_rw(&storage,transaction,size,0x10);
  populate<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
            (storage.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,first,last);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&storage.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  eVar1.size = size;
  eVar1.addr.a_.a_ = (address)(address)storage.second.a_;
  return eVar1;
}

Assistant:

auto fragment::alloc (Transaction & transaction, Iterator const first, Iterator const last)
            -> pstore::extent<fragment> {
            fragment::check_range_is_sorted (first, last);
            // Compute the number of bytes of storage that we'll need for this fragment.
            auto const size = fragment::size_bytes (first, last);

            // Allocate storage for the fragment including its three arrays.
            // We can't use the version of alloc_rw() which returns typed_address<> since we need
            // an explicit number of bytes allocated for the fragment.
            std::pair<std::shared_ptr<void>, pstore::address> const storage =
                transaction.alloc_rw (size, alignof (fragment));
            fragment::populate (storage.first.get (), first, last);
            return {typed_address<fragment> (storage.second), size};
        }